

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode multi_runsingle(Curl_multi *multi,curltime now,Curl_easy *data)

{
  int *piVar1;
  undefined1 *puVar2;
  connectdata *pcVar3;
  Curl_do_more_func p_Var4;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var5;
  multidone_func p_Var6;
  uint uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  undefined4 uVar23;
  curltime now_00;
  curltime now_01;
  curltime now_02;
  curltime now_03;
  _Bool _Var24;
  CURLMstate oldstate;
  int iVar25;
  CURLcode CVar26;
  CURLcode CVar27;
  CURLcode CVar28;
  int iVar29;
  timediff_t tVar30;
  long lVar31;
  long lVar32;
  CURLMstate CVar33;
  char *pcVar34;
  connectdata *conn;
  followtype type;
  bool bVar35;
  bool bVar36;
  curltime now_04;
  curltime now_05;
  curltime now_06;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime newer_02;
  curltime start;
  curltime start_00;
  curltime start_01;
  curltime start_02;
  _Bool protocol_connect;
  _Bool dophase_done;
  _Bool done;
  _Bool comeback;
  char *newurl;
  _Bool async;
  _Bool connected;
  int control;
  _Bool local_84;
  _Bool local_83;
  _Bool local_82;
  _Bool local_81;
  Curl_dns_entry *local_80;
  _Bool local_72;
  _Bool local_71;
  curltime local_70;
  CURLMcode local_60;
  int local_5c;
  curl_llist_element *local_58;
  curl_llist_element *local_50;
  curl_llist *local_48;
  curl_llist *local_40;
  Curl_message *local_38;
  
  local_70.tv_sec = now.tv_sec;
  local_70.tv_usec = now.tv_usec;
  local_84 = false;
  local_83 = false;
  local_82 = false;
  if (data == (Curl_easy *)0x0) {
    return CURLM_BAD_EASY_HANDLE;
  }
  if (data->magic != 0xc0dedbad) {
    return CURLM_BAD_EASY_HANDLE;
  }
  local_58 = &data->conn_queue;
  local_48 = &multi->pending;
  local_50 = &data->connect_queue;
  local_38 = &data->msg;
  local_40 = &multi->msglist;
  CVar26 = CURLE_OK;
LAB_004d4d4e:
  if ((data->conn == (connectdata *)0x0) && (data->mstate - CURLM_STATE_WAITRESOLVE < 0xb)) {
    Curl_failf(data,"In state %d with no conn, bail out!\n");
switchD_004d4df0_default:
    bVar35 = false;
    local_60 = CURLM_INTERNAL_ERROR;
    bVar36 = false;
    goto LAB_004d5be5;
  }
  _Var24 = multi->recheckstate;
  multi->recheckstate = false;
  if (_Var24 == true) {
    process_pending_handles(multi);
  }
  pcVar3 = data->conn;
  if (pcVar3 != (connectdata *)0x0) {
    if (data->mstate - CURLM_STATE_WAITRESOLVE < 0xc) {
      pcVar3->data = data;
    }
    if (((pcVar3 == (connectdata *)0x0) || (0xc < data->mstate - CURLM_STATE_CONNECT)) ||
       (tVar30 = Curl_timeleft(data,&local_70,data->mstate < CURLM_STATE_DOING), -1 < tVar30))
    goto LAB_004d4dde;
    if (data->mstate == CURLM_STATE_WAITCONNECT) {
      newer_00.tv_usec = local_70.tv_usec;
      newer_00.tv_sec = local_70.tv_sec;
      uVar14 = (data->progress).t_startsingle.tv_sec;
      uVar15 = (data->progress).t_startsingle.tv_usec;
      older_00.tv_usec = uVar15;
      older_00.tv_sec = uVar14;
      older_00._12_4_ = 0;
      newer_00._12_4_ = 0;
      tVar30 = Curl_timediff(newer_00,older_00);
      pcVar34 = "Connection timed out after %ld milliseconds";
LAB_004d5480:
      Curl_failf(data,pcVar34,tVar30);
    }
    else {
      if (data->mstate == CURLM_STATE_WAITRESOLVE) {
        newer.tv_usec = local_70.tv_usec;
        newer.tv_sec = local_70.tv_sec;
        uVar8 = (data->progress).t_startsingle.tv_sec;
        uVar9 = (data->progress).t_startsingle.tv_usec;
        older.tv_usec = uVar9;
        older.tv_sec = uVar8;
        older._12_4_ = 0;
        newer._12_4_ = 0;
        tVar30 = Curl_timediff(newer,older);
        pcVar34 = "Resolving timed out after %ld milliseconds";
        goto LAB_004d5480;
      }
      newer_02.tv_usec = local_70.tv_usec;
      newer_02.tv_sec = local_70.tv_sec;
      newer_01.tv_usec = local_70.tv_usec;
      newer_01.tv_sec = local_70.tv_sec;
      if ((data->req).size == -1) {
        uVar20 = (data->progress).t_startsingle.tv_sec;
        uVar21 = (data->progress).t_startsingle.tv_usec;
        older_02.tv_usec = uVar21;
        older_02.tv_sec = uVar20;
        older_02._12_4_ = 0;
        newer_02._12_4_ = 0;
        tVar30 = Curl_timediff(newer_02,older_02);
        Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar30,
                   (data->req).bytecount);
      }
      else {
        uVar16 = (data->progress).t_startsingle.tv_sec;
        uVar17 = (data->progress).t_startsingle.tv_usec;
        older_01.tv_usec = uVar17;
        older_01.tv_sec = uVar16;
        older_01._12_4_ = 0;
        newer_01._12_4_ = 0;
        tVar30 = Curl_timediff(newer_01,older_01);
        Curl_failf(data,
                   "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                   tVar30,(data->req).bytecount,(data->req).size);
      }
    }
    bVar35 = CURLM_STATE_DO < data->mstate;
    if (bVar35) {
      Curl_conncontrol(data->conn,2);
    }
    CVar26 = CURLE_OPERATION_TIMEDOUT;
    _Var24 = true;
LAB_004d5921:
    iVar25 = 0;
    multi_done(data,CVar26,_Var24);
    goto LAB_004d5aa9;
  }
LAB_004d4dde:
  iVar25 = 0;
  switch(data->mstate) {
  case CURLM_STATE_INIT:
    CVar26 = Curl_pretransfer(data);
    if (CVar26 == CURLE_OK) {
      if (data->mstate != CURLM_STATE_CONNECT) {
        data->mstate = CURLM_STATE_CONNECT;
        Curl_init_CONNECT(data);
      }
      Curl_pgrsTime(data,TIMER_STARTOP);
LAB_004d57d5:
      iVar25 = -1;
      goto LAB_004d57dd;
    }
LAB_004d5780:
    bVar35 = false;
    goto LAB_004d5a60;
  case CURLM_STATE_CONNECT_PEND:
  case CURLM_STATE_COMPLETED:
    goto switchD_004d4df0_caseD_1;
  case CURLM_STATE_CONNECT:
    Curl_pgrsTime(data,TIMER_STARTSINGLE);
    lVar31 = (data->set).timeout;
    if (lVar31 != 0) {
      Curl_expire(data,lVar31,EXPIRE_TIMEOUT);
    }
    lVar31 = (data->set).connecttimeout;
    if (lVar31 != 0) {
      Curl_expire(data,lVar31,EXPIRE_CONNECTTIMEOUT);
    }
    CVar26 = Curl_connect(data,&local_72,&local_84);
    if (CVar26 == CURLE_NO_CONNECTION_AVAILABLE) {
      if (data->mstate != CURLM_STATE_CONNECT_PEND) {
        data->mstate = CURLM_STATE_CONNECT_PEND;
      }
      Curl_llist_insert_next(local_48,(multi->pending).tail,data,local_50);
    }
    else {
      if (((data->state).field_0x4e5 & 0x20) != 0) {
        Curl_infof(data,"Transfer was pending, now try another\n");
        process_pending_handles(data->multi);
      }
      if (CVar26 != CURLE_OK) goto LAB_004d5780;
      if (local_72 != true) {
        if (local_84 == true) goto LAB_004d5a6f;
        _Var24 = Curl_connect_ongoing(data->conn);
        iVar25 = -1;
        if (_Var24) {
          if (data->mstate != CURLM_STATE_WAITPROXYCONNECT) {
            data->mstate = CURLM_STATE_WAITPROXYCONNECT;
          }
        }
        else if (data->mstate != CURLM_STATE_WAITCONNECT) {
          data->mstate = CURLM_STATE_WAITCONNECT;
        }
        goto LAB_004d57dd;
      }
      bVar35 = false;
      CVar26 = CURLE_OK;
      iVar25 = 0;
      if (data->mstate == CURLM_STATE_WAITRESOLVE) break;
      data->mstate = CURLM_STATE_WAITRESOLVE;
    }
LAB_004d5a5a:
    bVar35 = false;
    CVar26 = CURLE_OK;
LAB_004d5a60:
    iVar25 = 0;
    break;
  case CURLM_STATE_WAITRESOLVE:
    local_80 = (Curl_dns_entry *)0x0;
    pcVar3 = data->conn;
    uVar7 = *(uint *)&(pcVar3->bits).field_0x4;
    lVar31 = 0x100;
    if ((uVar7 & 4) == 0) {
      lVar31 = 0xd0;
    }
    if ((uVar7 & 0x20) != 0) {
      lVar31 = 0x160;
    }
    pcVar34 = *(char **)((pcVar3->chunk).hexbuffer + lVar31 + -0x20);
    local_80 = Curl_fetch_addr(pcVar3,pcVar34,(int)pcVar3->port);
    if (local_80 != (Curl_dns_entry *)0x0) {
      CVar26 = CURLE_OK;
      Curl_infof(data,"Hostname \'%s\' was found in DNS cache\n",pcVar34);
    }
    if (local_80 == (Curl_dns_entry *)0x0) {
      CVar26 = Curl_resolv_check(data->conn,&local_80);
    }
    singlesocket(multi,data);
    iVar25 = 0;
    if (local_80 != (Curl_dns_entry *)0x0) {
      CVar26 = Curl_once_resolved(data->conn,&local_84);
      if (CVar26 == CURLE_OK) {
        if (local_84 == true) {
          iVar25 = -1;
          CVar26 = CURLE_OK;
          if (data->mstate != CURLM_STATE_DO) {
            data->mstate = CURLM_STATE_DO;
            Curl_connect_free(data);
          }
        }
        else {
          _Var24 = Curl_connect_ongoing(data->conn);
          iVar25 = -1;
          CVar27 = CURLE_OK;
          CVar26 = CVar27;
          if (_Var24) {
            CVar26 = CURLE_OK;
            if (data->mstate != CURLM_STATE_WAITPROXYCONNECT) {
              data->mstate = CURLM_STATE_WAITPROXYCONNECT;
              CVar26 = CVar27;
            }
          }
          else if (data->mstate != CURLM_STATE_WAITCONNECT) {
            data->mstate = CURLM_STATE_WAITCONNECT;
          }
        }
      }
      else {
        data->conn = (connectdata *)0x0;
      }
    }
    bVar35 = CVar26 != CURLE_OK;
    break;
  case CURLM_STATE_WAITCONNECT:
    CVar26 = Curl_is_connected(data->conn,0,&local_71);
    if ((CVar26 == CURLE_OK & local_71) != 1) {
      iVar25 = 0;
      if (CVar26 != CURLE_OK) goto LAB_004d53b2;
      goto LAB_004d57dd;
    }
    pcVar3 = data->conn;
    if ((((pcVar3->http_proxy).proxytype != CURLPROXY_HTTPS) ||
        ((pcVar3->bits).proxy_ssl_connected[0] == true)) &&
       (_Var24 = Curl_connect_ongoing(pcVar3), !_Var24)) {
      uVar7 = *(uint *)&(data->conn->bits).field_0x4 >> 0xe;
      iVar25 = 5;
LAB_004d57ca:
      CVar33 = (iVar25 + 1) - (uint)((uVar7 & 1) != 0);
LAB_004d57cd:
      mstate(data,CVar33);
      goto LAB_004d57d5;
    }
    bVar35 = false;
    CVar26 = CURLE_OK;
    iVar25 = 0;
    if (data->mstate != CURLM_STATE_WAITPROXYCONNECT) {
      data->mstate = CURLM_STATE_WAITPROXYCONNECT;
      goto LAB_004d5a5a;
    }
    break;
  case CURLM_STATE_WAITPROXYCONNECT:
    CVar26 = Curl_http_connect(data->conn,&local_84);
    pcVar3 = data->conn;
    if (((pcVar3->bits).field_0x6 & 0x80) == 0) {
      if (CVar26 != CURLE_OK) goto LAB_004d53ca;
      if ((pcVar3->http_proxy).proxytype == CURLPROXY_HTTPS) {
        bVar35 = false;
        CVar26 = CURLE_OK;
        iVar25 = 0;
        if ((pcVar3->bits).proxy_ssl_connected[0] != true) break;
      }
      _Var24 = Curl_connect_complete(pcVar3);
      bVar35 = false;
      CVar26 = CURLE_OK;
      iVar25 = 0;
      if (!_Var24) break;
      iVar25 = -1;
      if (data->mstate != CURLM_STATE_SENDPROTOCONNECT) {
        data->mstate = CURLM_STATE_SENDPROTOCONNECT;
      }
    }
    else {
      multi_done(data,CURLE_OK,false);
      iVar25 = -1;
      if (data->mstate != CURLM_STATE_CONNECT) {
        data->mstate = CURLM_STATE_CONNECT;
        Curl_init_CONNECT(data);
      }
    }
LAB_004d57dd:
    bVar35 = false;
    CVar26 = CURLE_OK;
    break;
  case CURLM_STATE_SENDPROTOCONNECT:
    CVar26 = Curl_protocol_connect(data->conn,&local_84);
    if (CVar26 == CURLE_OK) {
      CVar33 = data->mstate;
      if (local_84 != false) {
joined_r0x004d52d2:
        iVar25 = -1;
        if (CVar33 != CURLM_STATE_DO) {
          iVar25 = -1;
          data->mstate = CURLM_STATE_DO;
          Curl_connect_free(data);
        }
        goto LAB_004d57dd;
      }
      bVar35 = false;
      CVar26 = CURLE_OK;
      iVar25 = 0;
      if (CVar33 != CURLM_STATE_PROTOCONNECT) {
        data->mstate = CURLM_STATE_PROTOCONNECT;
        goto LAB_004d5a5a;
      }
    }
    else {
LAB_004d53b2:
      Curl_posttransfer(data);
      _Var24 = true;
LAB_004d53c5:
      multi_done(data,CVar26,_Var24);
LAB_004d53ca:
      iVar25 = 0;
      bVar35 = true;
    }
    break;
  case CURLM_STATE_PROTOCONNECT:
    CVar26 = Curl_protocol_connecting(data->conn,&local_84);
    if (CVar26 != CURLE_OK) goto LAB_004d53b2;
    bVar35 = false;
    CVar26 = CURLE_OK;
    iVar25 = 0;
    if (local_84 == true) {
LAB_004d5a6f:
      CVar33 = data->mstate;
      goto joined_r0x004d52d2;
    }
    break;
  case CURLM_STATE_DO:
    pcVar3 = data->conn;
    if (((data->set).field_0x87c & 0x20) == 0) {
      p_Var5 = pcVar3->handler->do_it;
      if (p_Var5 == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
LAB_004d50a3:
        CVar26 = CURLE_OK;
      }
      else {
        CVar26 = (*p_Var5)(pcVar3,&local_83);
        if (CVar26 == CURLE_OK) {
          if (local_83 == true) {
            puVar2 = &(pcVar3->data->req).field_0x570;
            *(ushort *)puVar2 = *(ushort *)puVar2 & 0xffdf;
            Curl_pgrsTime(pcVar3->data,TIMER_PRETRANSFER);
          }
          goto LAB_004d50a3;
        }
      }
      if (CVar26 == CURLE_SEND_ERROR) {
        if (((data->conn->bits).field_0x4 & 2) == 0) goto LAB_004d5943;
        local_80 = (Curl_dns_entry *)0x0;
        CVar27 = Curl_retry_request(data->conn,(char **)&local_80);
        bVar35 = CVar27 != CURLE_OK;
        if (!bVar35) {
          CVar27 = CURLE_SEND_ERROR;
        }
        Curl_posttransfer(data);
        iVar25 = 0;
        CVar26 = multi_done(data,CVar27,false);
        if (local_80 == (Curl_dns_entry *)0x0) {
          bVar35 = true;
          CVar26 = CVar27;
        }
        else if (((CVar26 == CURLE_SEND_ERROR) || (CVar26 == CURLE_OK)) &&
                (CVar26 = Curl_follow(data,(char *)local_80,FOLLOW_RETRY), CVar26 == CURLE_OK)) {
          iVar25 = -1;
          CVar26 = CURLE_OK;
          if (data->mstate != CURLM_STATE_CONNECT) {
            data->mstate = CURLM_STATE_CONNECT;
            Curl_init_CONNECT(data);
          }
        }
        (*Curl_cfree)(local_80);
      }
      else {
        if (CVar26 != CURLE_OK) {
LAB_004d5943:
          Curl_posttransfer(data);
          bVar35 = true;
          if (data->conn != (connectdata *)0x0) {
            _Var24 = false;
            goto LAB_004d5921;
          }
          goto LAB_004d5a60;
        }
        if (local_83 == false) {
          if (((data->state).field_0x4e4 & 0x80) != 0) {
            CVar26 = CURLE_OK;
            if (((data->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE) {
              bVar36 = false;
              multi_done(data,CURLE_OK,false);
              iVar25 = -1;
              if (data->mstate != CURLM_STATE_DONE) {
                data->mstate = CURLM_STATE_DONE;
                bVar36 = false;
              }
            }
            else {
              bVar36 = true;
              iVar25 = 0;
            }
            bVar35 = false;
            if (!bVar36) break;
          }
          bVar35 = false;
          CVar26 = CURLE_OK;
          iVar25 = 0;
          if (data->mstate != CURLM_STATE_DOING) {
            data->mstate = CURLM_STATE_DOING;
            goto LAB_004d5a5a;
          }
        }
        else {
          if (((data->conn->bits).field_0x5 & 8) == 0) {
            iVar25 = -1;
            if (data->mstate != CURLM_STATE_DO_DONE) {
              data->mstate = CURLM_STATE_DO_DONE;
            }
            goto LAB_004d57dd;
          }
          bVar35 = false;
          CVar26 = CURLE_OK;
          iVar25 = 0;
          if (data->mstate != CURLM_STATE_DO_MORE) {
            data->mstate = CURLM_STATE_DO_MORE;
            goto LAB_004d5a5a;
          }
        }
      }
    }
    else {
      Curl_conncontrol(pcVar3,0);
      iVar25 = -1;
      if (data->mstate != CURLM_STATE_DONE) {
        data->mstate = CURLM_STATE_DONE;
      }
LAB_004d5a9f:
      bVar35 = false;
      CVar26 = CURLE_OK;
    }
    break;
  case CURLM_STATE_DOING:
    CVar26 = Curl_protocol_doing(data->conn,&local_83);
    if (CVar26 != CURLE_OK) {
      Curl_posttransfer(data);
      _Var24 = false;
      goto LAB_004d53c5;
    }
    bVar35 = false;
    CVar26 = CURLE_OK;
    iVar25 = 0;
    if (local_83 == true) {
      uVar7 = *(uint *)&(data->conn->bits).field_0x4 >> 0xb;
      iVar25 = 10;
      goto LAB_004d57ca;
    }
    break;
  case CURLM_STATE_DO_MORE:
    pcVar3 = data->conn;
    local_5c = 0;
    p_Var4 = pcVar3->handler->do_more;
    if (p_Var4 == (Curl_do_more_func)0x0) {
      CVar26 = CURLE_OK;
    }
    else {
      CVar26 = (*p_Var4)(pcVar3,&local_5c);
    }
    if ((CVar26 == CURLE_OK) && (local_5c == 1)) {
      puVar2 = &(pcVar3->data->req).field_0x570;
      *(ushort *)puVar2 = *(ushort *)puVar2 & 0xffdf;
      Curl_pgrsTime(pcVar3->data,TIMER_PRETRANSFER);
    }
    if (CVar26 == CURLE_OK) {
      if (local_5c != 0) {
        CVar33 = (uint)(local_5c == 1) * 2 + CURLM_STATE_DOING;
        goto LAB_004d57cd;
      }
      goto LAB_004d5a5a;
    }
    Curl_posttransfer(data);
    iVar25 = 0;
    multi_done(data,CVar26,false);
    bVar35 = true;
    break;
  case CURLM_STATE_DO_DONE:
    if (((data->conn->bits).field_0x7 & 4) != 0) {
      process_pending_handles(multi);
    }
    pcVar3 = data->conn;
    if ((pcVar3->sockfd == -1) && (pcVar3->writesockfd == -1)) {
      if ((((data->state).field_0x4e4 & 0x80) != 0) && ((pcVar3->handler->flags & 0x1000) == 0)) {
        (data->wildcard).state = CURLWC_DONE;
      }
      iVar25 = -1;
      if (data->mstate != CURLM_STATE_DONE) {
        data->mstate = CURLM_STATE_DONE;
      }
    }
    else {
      iVar25 = -1;
      if (data->mstate != CURLM_STATE_PERFORM) {
        data->mstate = CURLM_STATE_PERFORM;
      }
    }
    goto switchD_004d4df0_caseD_1;
  case CURLM_STATE_PERFORM:
    local_80 = (Curl_dns_entry *)0x0;
    local_81 = false;
    lVar31 = (data->set).max_send_speed;
    if (lVar31 < 1) {
      lVar31 = 0;
    }
    else {
      uVar12 = (data->progress).ul_limit_start.tv_sec;
      uVar13 = (data->progress).ul_limit_start.tv_usec;
      start_00.tv_usec = uVar13;
      start_00.tv_sec = uVar12;
      now_01._12_4_ = local_70._12_4_;
      now_01.tv_usec = local_70.tv_usec;
      now_01.tv_sec = local_70.tv_sec;
      start_00._12_4_ = 0;
      lVar31 = Curl_pgrsLimitWaitTime
                         ((data->progress).uploaded,(data->progress).ul_limit_size,lVar31,start_00,
                          now_01);
    }
    lVar32 = (data->set).max_recv_speed;
    if (lVar32 < 1) {
      tVar30 = 0;
    }
    else {
      uVar18 = (data->progress).dl_limit_start.tv_sec;
      uVar19 = (data->progress).dl_limit_start.tv_usec;
      start_01.tv_usec = uVar19;
      start_01.tv_sec = uVar18;
      now_02._12_4_ = local_70._12_4_;
      now_02.tv_usec = local_70.tv_usec;
      now_02.tv_sec = local_70.tv_sec;
      start_01._12_4_ = 0;
      tVar30 = Curl_pgrsLimitWaitTime
                         ((data->progress).downloaded,(data->progress).dl_limit_size,lVar32,start_01
                          ,now_02);
    }
    if (lVar31 == 0 && tVar30 == 0) {
      CVar26 = Curl_readwrite(data->conn,data,&local_82,&local_81);
      if ((CVar26 == CURLE_RECV_ERROR | local_82) == 1) {
        CVar28 = Curl_retry_request(data->conn,(char **)&local_80);
        CVar27 = CVar26;
        if (CVar26 == CURLE_OK) {
          CVar27 = CVar28;
        }
        bVar36 = CVar28 == CURLE_OK;
        if (bVar36) {
          CVar27 = CVar26;
        }
        CVar26 = CVar27;
        bVar35 = bVar36 && local_80 != (Curl_dns_entry *)0x0;
        if (bVar36 && local_80 != (Curl_dns_entry *)0x0) {
          local_82 = true;
          bVar35 = true;
          CVar26 = CURLE_OK;
        }
      }
      else {
        bVar35 = false;
      }
      if (CVar26 != CURLE_OK) {
        if ((CVar26 != CURLE_HTTP2_STREAM) && ((data->conn->handler->flags & 2) == 0)) {
          Curl_conncontrol(data->conn,2);
        }
        Curl_posttransfer(data);
        multi_done(data,CVar26,true);
        goto LAB_004d5780;
      }
      if (local_82 != true) {
        iVar25 = -(uint)local_81;
        goto LAB_004d5a9f;
      }
      Curl_posttransfer(data);
      if (!(bool)(~bVar35 & (data->req).newurl == (char *)0x0)) {
        type = FOLLOW_RETRY;
        if (!bVar35) {
          (*Curl_cfree)(local_80);
          local_80 = (Curl_dns_entry *)(data->req).newurl;
          (data->req).newurl = (char *)0x0;
          type = FOLLOW_REDIR;
        }
        iVar25 = 0;
        multi_done(data,CURLE_OK,false);
        CVar26 = Curl_follow(data,(char *)local_80,type);
        if ((CVar26 == CURLE_OK) && (iVar25 = -1, data->mstate != CURLM_STATE_CONNECT)) {
          data->mstate = CURLM_STATE_CONNECT;
          Curl_init_CONNECT(data);
        }
        (*Curl_cfree)(local_80);
        goto switchD_004d4df0_caseD_1;
      }
      iVar25 = 0;
      if ((data->req).location == (char *)0x0) {
        bVar35 = false;
        CVar26 = CURLE_OK;
      }
      else {
        (*Curl_cfree)(local_80);
        local_80 = (Curl_dns_entry *)(data->req).location;
        (data->req).location = (char *)0x0;
        CVar26 = Curl_follow(data,(char *)local_80,FOLLOW_FAKE);
        (*Curl_cfree)(local_80);
        if (CVar26 == CURLE_OK) {
          bVar35 = false;
          CVar26 = CURLE_OK;
        }
        else {
          CVar26 = multi_done(data,CVar26,true);
          bVar35 = true;
        }
      }
      if (CVar26 == CURLE_OK) {
        iVar25 = -1;
        CVar26 = CURLE_OK;
        if (data->mstate != CURLM_STATE_DONE) {
          data->mstate = CURLM_STATE_DONE;
        }
      }
    }
    else {
      now_05.tv_usec = local_70.tv_usec;
      now_05.tv_sec = local_70.tv_sec;
      now_05._12_4_ = 0;
      Curl_ratelimit(data,now_05);
      if (data->mstate != CURLM_STATE_TOOFAST) {
        data->mstate = CURLM_STATE_TOOFAST;
      }
      if (lVar31 < tVar30) {
        lVar31 = tVar30;
      }
      Curl_expire(data,lVar31,EXPIRE_TOOFAST);
      bVar35 = false;
      iVar25 = 0;
    }
    break;
  case CURLM_STATE_TOOFAST:
    iVar25 = Curl_pgrsUpdate(data->conn);
    CVar26 = CURLE_ABORTED_BY_CALLBACK;
    if (iVar25 == 0) {
      now_04.tv_usec = local_70.tv_usec;
      now_04.tv_sec = local_70.tv_sec;
      now_04._12_4_ = 0;
      CVar26 = Curl_speedcheck(data,now_04);
    }
    bVar35 = false;
    iVar25 = 0;
    if (CVar26 == CURLE_OK) {
      lVar31 = (data->set).max_send_speed;
      if (lVar31 < 1) {
        lVar31 = 0;
      }
      else {
        uVar10 = (data->progress).ul_limit_start.tv_sec;
        uVar11 = (data->progress).ul_limit_start.tv_usec;
        start.tv_usec = uVar11;
        start.tv_sec = uVar10;
        now_00._12_4_ = local_70._12_4_;
        now_00.tv_usec = local_70.tv_usec;
        now_00.tv_sec = local_70.tv_sec;
        start._12_4_ = 0;
        lVar31 = Curl_pgrsLimitWaitTime
                           ((data->progress).uploaded,(data->progress).ul_limit_size,lVar31,start,
                            now_00);
      }
      lVar32 = (data->set).max_recv_speed;
      if (lVar32 < 1) {
        lVar32 = 0;
      }
      else {
        uVar22 = (data->progress).dl_limit_start.tv_sec;
        uVar23 = (data->progress).dl_limit_start.tv_usec;
        start_02.tv_usec = uVar23;
        start_02.tv_sec = uVar22;
        now_03._12_4_ = local_70._12_4_;
        now_03.tv_usec = local_70.tv_usec;
        now_03.tv_sec = local_70.tv_sec;
        start_02._12_4_ = 0;
        lVar32 = Curl_pgrsLimitWaitTime
                           ((data->progress).downloaded,(data->progress).dl_limit_size,lVar32,
                            start_02,now_03);
      }
      if (lVar31 == 0 && lVar32 == 0) {
        if (data->mstate != CURLM_STATE_PERFORM) {
          data->mstate = CURLM_STATE_PERFORM;
        }
        now_06.tv_usec = local_70.tv_usec;
        now_06.tv_sec = local_70.tv_sec;
        now_06._12_4_ = 0;
        Curl_ratelimit(data,now_06);
      }
      else {
        if (lVar31 < lVar32) {
          lVar31 = lVar32;
        }
        Curl_expire(data,lVar31,EXPIRE_TOOFAST);
      }
      goto LAB_004d5a5a;
    }
    break;
  case CURLM_STATE_DONE:
    if (data->conn != (connectdata *)0x0) {
      if (((data->conn->bits).field_0x7 & 4) != 0) {
        process_pending_handles(multi);
      }
      CVar27 = multi_done(data,CVar26,false);
      if (CVar26 != CURLE_OK) {
        CVar27 = CVar26;
      }
      CVar26 = CVar27;
      if (data->conn != (connectdata *)0x0) {
        Curl_llist_remove(&data->conn->easyq,local_58,(void *)0x0);
        data->conn = (connectdata *)0x0;
      }
    }
    if ((((data->state).field_0x4e4 & 0x80) == 0) || ((data->wildcard).state == CURLWC_DONE)) {
      if (data->mstate != CURLM_STATE_COMPLETED) {
        data->mstate = CURLM_STATE_COMPLETED;
        piVar1 = &data->multi->num_alive;
        *piVar1 = *piVar1 + -1;
        Curl_init_completed(data);
      }
    }
    else if (data->mstate != CURLM_STATE_INIT) {
      data->mstate = CURLM_STATE_INIT;
    }
    iVar25 = -1;
    bVar35 = false;
    break;
  case CURLM_STATE_MSGSENT:
    data->result = CVar26;
    bVar35 = false;
    bVar36 = false;
    local_60 = CURLM_OK;
    goto LAB_004d5be5;
  default:
    goto switchD_004d4df0_default;
  }
LAB_004d5aa9:
  if (data->mstate < CURLM_STATE_COMPLETED) {
    if (CVar26 == CURLE_OK) {
      CVar26 = CURLE_OK;
      if ((data->conn != (connectdata *)0x0) && (iVar29 = Curl_pgrsUpdate(data->conn), iVar29 != 0))
      {
        Curl_conncontrol(data->conn,2);
        mstate(data,CURLM_STATE_COMPLETED - (data->mstate < CURLM_STATE_DONE));
        iVar25 = -1;
        CVar26 = CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      process_pending_handles(multi);
      if (data->conn == (connectdata *)0x0) {
        if (data->mstate == CURLM_STATE_CONNECT) {
          Curl_posttransfer(data);
        }
      }
      else if (bVar35) {
        Curl_disconnect(data,data->conn,CVar26 == CURLE_OPERATION_TIMEDOUT);
        if (data->conn != (connectdata *)0x0) {
          Curl_llist_remove(&data->conn->easyq,local_58,(void *)0x0);
        }
        data->conn = (connectdata *)0x0;
      }
      iVar25 = -1;
      if (data->mstate != CURLM_STATE_COMPLETED) {
        data->mstate = CURLM_STATE_COMPLETED;
        piVar1 = &data->multi->num_alive;
        *piVar1 = *piVar1 + -1;
        Curl_init_completed(data);
      }
    }
  }
  if (data->mstate == CURLM_STATE_COMPLETED) {
    p_Var6 = (data->set).fmultidone;
    if (p_Var6 == (multidone_func)0x0) {
      (data->msg).extmsg.msg = CURLMSG_DONE;
      (data->msg).extmsg.easy_handle = data;
      (data->msg).extmsg.data.result = CVar26;
      Curl_llist_insert_next(local_40,(multi->msglist).tail,local_38,&local_38->list);
      iVar25 = 0;
    }
    else {
      (*p_Var6)(data,CVar26);
    }
    if (data->mstate != CURLM_STATE_MSGSENT) {
      data->mstate = CURLM_STATE_MSGSENT;
    }
  }
  bVar36 = iVar25 == -1;
  bVar35 = true;
LAB_004d5be5:
  if (!bVar35) {
    return local_60;
  }
  if ((!bVar36) && (multi->recheckstate == false)) {
    data->result = CVar26;
    return CURLM_OK;
  }
  goto LAB_004d4d4e;
switchD_004d4df0_caseD_1:
  bVar35 = false;
  goto LAB_004d5aa9;
}

Assistant:

static CURLMcode multi_runsingle(struct Curl_multi *multi,
                                 struct curltime now,
                                 struct Curl_easy *data)
{
  struct Curl_message *msg = NULL;
  bool connected;
  bool async;
  bool protocol_connect = FALSE;
  bool dophase_done = FALSE;
  bool done = FALSE;
  CURLMcode rc;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  timediff_t recv_timeout_ms;
  timediff_t send_timeout_ms;
  int control;

  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  do {
    /* A "stream" here is a logical stream if the protocol can handle that
       (HTTP/2), or the full connection for older protocols */
    bool stream_error = FALSE;
    rc = CURLM_OK;

    if(!data->conn &&
       data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_DONE) {
      /* In all these states, the code will blindly access 'data->conn'
         so this is precaution that it isn't NULL. And it silences static
         analyzers. */
      failf(data, "In state %d with no conn, bail out!\n", data->mstate);
      return CURLM_INTERNAL_ERROR;
    }

    if(multi_ischanged(multi, TRUE)) {
      DEBUGF(infof(data, "multi changed, check CONNECT_PEND queue!\n"));
      process_pending_handles(multi); /* multiplexed */
    }

    if(data->conn && data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_COMPLETED) {
      /* Make sure we set the connection's current owner */
      data->conn->data = data;
    }

    if(data->conn &&
       (data->mstate >= CURLM_STATE_CONNECT) &&
       (data->mstate < CURLM_STATE_COMPLETED)) {
      /* we need to wait for the connect state as only then is the start time
         stored, but we must not check already completed handles */
      timeout_ms = Curl_timeleft(data, &now,
                                 (data->mstate <= CURLM_STATE_DO)?
                                 TRUE:FALSE);

      if(timeout_ms < 0) {
        /* Handle timed out */
        if(data->mstate == CURLM_STATE_WAITRESOLVE)
          failf(data, "Resolving timed out after %" CURL_FORMAT_TIMEDIFF_T
                " milliseconds",
                Curl_timediff(now, data->progress.t_startsingle));
        else if(data->mstate == CURLM_STATE_WAITCONNECT)
          failf(data, "Connection timed out after %" CURL_FORMAT_TIMEDIFF_T
                " milliseconds",
                Curl_timediff(now, data->progress.t_startsingle));
        else {
          struct SingleRequest *k = &data->req;
          if(k->size != -1) {
            failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
                  " milliseconds with %" CURL_FORMAT_CURL_OFF_T " out of %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_timediff(now, data->progress.t_startsingle),
                  k->bytecount, k->size);
          }
          else {
            failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
                  " milliseconds with %" CURL_FORMAT_CURL_OFF_T
                  " bytes received",
                  Curl_timediff(now, data->progress.t_startsingle),
                  k->bytecount);
          }
        }

        /* Force connection closed if the connection has indeed been used */
        if(data->mstate > CURLM_STATE_DO) {
          streamclose(data->conn, "Disconnected with pending data");
          stream_error = TRUE;
        }
        result = CURLE_OPERATION_TIMEDOUT;
        (void)multi_done(data, result, TRUE);
        /* Skip the statemachine and go directly to error handling section. */
        goto statemachine_end;
      }
    }

    switch(data->mstate) {
    case CURLM_STATE_INIT:
      /* init this transfer. */
      result = Curl_pretransfer(data);

      if(!result) {
        /* after init, go CONNECT */
        multistate(data, CURLM_STATE_CONNECT);
        Curl_pgrsTime(data, TIMER_STARTOP);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_CONNECT_PEND:
      /* We will stay here until there is a connection available. Then
         we try again in the CURLM_STATE_CONNECT state. */
      break;

    case CURLM_STATE_CONNECT:
      /* Connect. We want to get a connection identifier filled in. */
      Curl_pgrsTime(data, TIMER_STARTSINGLE);
      if(data->set.timeout)
        Curl_expire(data, data->set.timeout, EXPIRE_TIMEOUT);

      if(data->set.connecttimeout)
        Curl_expire(data, data->set.connecttimeout, EXPIRE_CONNECTTIMEOUT);

      result = Curl_connect(data, &async, &protocol_connect);
      if(CURLE_NO_CONNECTION_AVAILABLE == result) {
        /* There was no connection available. We will go to the pending
           state and wait for an available connection. */
        multistate(data, CURLM_STATE_CONNECT_PEND);

        /* add this handle to the list of connect-pending handles */
        Curl_llist_insert_next(&multi->pending, multi->pending.tail, data,
                               &data->connect_queue);
        result = CURLE_OK;
        break;
      }
      else if(data->state.previouslypending) {
        /* this transfer comes from the pending queue so try move another */
        infof(data, "Transfer was pending, now try another\n");
        process_pending_handles(data->multi);
      }

      if(!result) {
        if(async)
          /* We're now waiting for an asynchronous name lookup */
          multistate(data, CURLM_STATE_WAITRESOLVE);
        else {
          /* after the connect has been sent off, go WAITCONNECT unless the
             protocol connect is already done and we can go directly to
             WAITDO or DO! */
          rc = CURLM_CALL_MULTI_PERFORM;

          if(protocol_connect)
            multistate(data, CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(Curl_connect_ongoing(data->conn))
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }
      break;

    case CURLM_STATE_WAITRESOLVE:
      /* awaiting an asynch name resolve to complete */
    {
      struct Curl_dns_entry *dns = NULL;
      struct connectdata *conn = data->conn;
      const char *hostname;

      DEBUGASSERT(conn);
      if(conn->bits.httpproxy)
        hostname = conn->http_proxy.host.name;
      else if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
      else
        hostname = conn->host.name;

      /* check if we have the name resolved by now */
      dns = Curl_fetch_addr(conn, hostname, (int)conn->port);

      if(dns) {
#ifdef CURLRES_ASYNCH
        conn->async.dns = dns;
        conn->async.done = TRUE;
#endif
        result = CURLE_OK;
        infof(data, "Hostname '%s' was found in DNS cache\n", hostname);
      }

      if(!dns)
        result = Curl_resolv_check(data->conn, &dns);

      /* Update sockets here, because the socket(s) may have been
         closed and the application thus needs to be told, even if it
         is likely that the same socket(s) will again be used further
         down.  If the name has not yet been resolved, it is likely
         that new sockets have been opened in an attempt to contact
         another resolver. */
      singlesocket(multi, data);

      if(dns) {
        /* Perform the next step in the connection phase, and then move on
           to the WAITCONNECT state */
        result = Curl_once_resolved(data->conn, &protocol_connect);

        if(result)
          /* if Curl_once_resolved() returns failure, the connection struct
             is already freed and gone */
          data->conn = NULL; /* no more connection */
        else {
          /* call again please so that we get the next socket setup */
          rc = CURLM_CALL_MULTI_PERFORM;
          if(protocol_connect)
            multistate(data, CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(Curl_connect_ongoing(data->conn))
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }

      if(result) {
        /* failure detected */
        stream_error = TRUE;
        break;
      }
    }
    break;

#ifndef CURL_DISABLE_HTTP
    case CURLM_STATE_WAITPROXYCONNECT:
      /* this is HTTP-specific, but sending CONNECT to a proxy is HTTP... */
      DEBUGASSERT(data->conn);
      result = Curl_http_connect(data->conn, &protocol_connect);

      if(data->conn->bits.proxy_connect_closed) {
        rc = CURLM_CALL_MULTI_PERFORM;
        /* connect back to proxy again */
        result = CURLE_OK;
        multi_done(data, CURLE_OK, FALSE);
        multistate(data, CURLM_STATE_CONNECT);
      }
      else if(!result) {
        if((data->conn->http_proxy.proxytype != CURLPROXY_HTTPS ||
           data->conn->bits.proxy_ssl_connected[FIRSTSOCKET]) &&
           Curl_connect_complete(data->conn)) {
          rc = CURLM_CALL_MULTI_PERFORM;
          /* initiate protocol connect phase */
          multistate(data, CURLM_STATE_SENDPROTOCONNECT);
        }
      }
      else if(result)
        stream_error = TRUE;
      break;
#endif

    case CURLM_STATE_WAITCONNECT:
      /* awaiting a completion of an asynch TCP connect */
      DEBUGASSERT(data->conn);
      result = Curl_is_connected(data->conn, FIRSTSOCKET, &connected);
      if(connected && !result) {
#ifndef CURL_DISABLE_HTTP
        if((data->conn->http_proxy.proxytype == CURLPROXY_HTTPS &&
            !data->conn->bits.proxy_ssl_connected[FIRSTSOCKET]) ||
           Curl_connect_ongoing(data->conn)) {
          multistate(data, CURLM_STATE_WAITPROXYCONNECT);
          break;
        }
#endif
        rc = CURLM_CALL_MULTI_PERFORM;
        multistate(data, data->conn->bits.tunnel_proxy?
                   CURLM_STATE_WAITPROXYCONNECT:
                   CURLM_STATE_SENDPROTOCONNECT);
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
        break;
      }
      break;

    case CURLM_STATE_SENDPROTOCONNECT:
      result = Curl_protocol_connect(data->conn, &protocol_connect);
      if(!result && !protocol_connect)
        /* switch to waiting state */
        multistate(data, CURLM_STATE_PROTOCONNECT);
      else if(!result) {
        /* protocol connect has completed, go WAITDO or DO */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_PROTOCONNECT:
      /* protocol-specific connect phase */
      result = Curl_protocol_connecting(data->conn, &protocol_connect);
      if(!result && protocol_connect) {
        /* after the connect has completed, go WAITDO or DO */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO:
      if(data->set.connect_only) {
        /* keep connection open for application to use the socket */
        connkeep(data->conn, "CONNECT_ONLY");
        multistate(data, CURLM_STATE_DONE);
        result = CURLE_OK;
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else {
        /* Perform the protocol's DO action */
        result = multi_do(data, &dophase_done);

        /* When multi_do() returns failure, data->conn might be NULL! */

        if(!result) {
          if(!dophase_done) {
#ifndef CURL_DISABLE_FTP
            /* some steps needed for wildcard matching */
            if(data->state.wildcardmatch) {
              struct WildcardData *wc = &data->wildcard;
              if(wc->state == CURLWC_DONE || wc->state == CURLWC_SKIP) {
                /* skip some states if it is important */
                multi_done(data, CURLE_OK, FALSE);
                multistate(data, CURLM_STATE_DONE);
                rc = CURLM_CALL_MULTI_PERFORM;
                break;
              }
            }
#endif
            /* DO was not completed in one function call, we must continue
               DOING... */
            multistate(data, CURLM_STATE_DOING);
            rc = CURLM_OK;
          }

          /* after DO, go DO_DONE... or DO_MORE */
          else if(data->conn->bits.do_more) {
            /* we're supposed to do more, but we need to sit down, relax
               and wait a little while first */
            multistate(data, CURLM_STATE_DO_MORE);
            rc = CURLM_OK;
          }
          else {
            /* we're done with the DO, now DO_DONE */
            multistate(data, CURLM_STATE_DO_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
        else if((CURLE_SEND_ERROR == result) &&
                data->conn->bits.reuse) {
          /*
           * In this situation, a connection that we were trying to use
           * may have unexpectedly died.  If possible, send the connection
           * back to the CONNECT phase so we can try again.
           */
          char *newurl = NULL;
          followtype follow = FOLLOW_NONE;
          CURLcode drc;

          drc = Curl_retry_request(data->conn, &newurl);
          if(drc) {
            /* a failure here pretty much implies an out of memory */
            result = drc;
            stream_error = TRUE;
          }

          Curl_posttransfer(data);
          drc = multi_done(data, result, FALSE);

          /* When set to retry the connection, we must to go back to
           * the CONNECT state */
          if(newurl) {
            if(!drc || (drc == CURLE_SEND_ERROR)) {
              follow = FOLLOW_RETRY;
              drc = Curl_follow(data, newurl, follow);
              if(!drc) {
                multistate(data, CURLM_STATE_CONNECT);
                rc = CURLM_CALL_MULTI_PERFORM;
                result = CURLE_OK;
              }
              else {
                /* Follow failed */
                result = drc;
              }
            }
            else {
              /* done didn't return OK or SEND_ERROR */
              result = drc;
            }
          }
          else {
            /* Have error handler disconnect conn if we can't retry */
            stream_error = TRUE;
          }
          free(newurl);
        }
        else {
          /* failure detected */
          Curl_posttransfer(data);
          if(data->conn)
            multi_done(data, result, FALSE);
          stream_error = TRUE;
        }
      }
      break;

    case CURLM_STATE_DOING:
      /* we continue DOING until the DO phase is complete */
      DEBUGASSERT(data->conn);
      result = Curl_protocol_doing(data->conn,
                                   &dophase_done);
      if(!result) {
        if(dophase_done) {
          /* after DO, go DO_DONE or DO_MORE */
          multistate(data, data->conn->bits.do_more?
                     CURLM_STATE_DO_MORE:
                     CURLM_STATE_DO_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        } /* dophase_done */
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_MORE:
      /*
       * When we are connected, DO MORE and then go DO_DONE
       */
      DEBUGASSERT(data->conn);
      result = multi_do_more(data->conn, &control);

      if(!result) {
        if(control) {
          /* if positive, advance to DO_DONE
             if negative, go back to DOING */
          multistate(data, control == 1?
                     CURLM_STATE_DO_DONE:
                     CURLM_STATE_DOING);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
        else
          /* stay in DO_MORE */
          rc = CURLM_OK;
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_DONE:
      DEBUGASSERT(data->conn);
      if(data->conn->bits.multiplex)
        /* Check if we can move pending requests to send pipe */
        process_pending_handles(multi); /*  multiplexed */

      /* Only perform the transfer if there's a good socket to work with.
         Having both BAD is a signal to skip immediately to DONE */
      if((data->conn->sockfd != CURL_SOCKET_BAD) ||
         (data->conn->writesockfd != CURL_SOCKET_BAD))
        multistate(data, CURLM_STATE_PERFORM);
      else {
#ifndef CURL_DISABLE_FTP
        if(data->state.wildcardmatch &&
           ((data->conn->handler->flags & PROTOPT_WILDCARD) == 0)) {
          data->wildcard.state = CURLWC_DONE;
        }
#endif
        multistate(data, CURLM_STATE_DONE);
      }
      rc = CURLM_CALL_MULTI_PERFORM;
      break;

    case CURLM_STATE_TOOFAST: /* limit-rate exceeded in either direction */
      DEBUGASSERT(data->conn);
      /* if both rates are within spec, resume transfer */
      if(Curl_pgrsUpdate(data->conn))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, now);

      if(!result) {
        send_timeout_ms = 0;
        if(data->set.max_send_speed > 0)
          send_timeout_ms =
            Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                   data->progress.ul_limit_size,
                                   data->set.max_send_speed,
                                   data->progress.ul_limit_start,
                                   now);

        recv_timeout_ms = 0;
        if(data->set.max_recv_speed > 0)
          recv_timeout_ms =
            Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                   data->progress.dl_limit_size,
                                   data->set.max_recv_speed,
                                   data->progress.dl_limit_start,
                                   now);

        if(!send_timeout_ms && !recv_timeout_ms) {
          multistate(data, CURLM_STATE_PERFORM);
          Curl_ratelimit(data, now);
        }
        else if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
      }
      break;

    case CURLM_STATE_PERFORM:
    {
      char *newurl = NULL;
      bool retry = FALSE;
      bool comeback = FALSE;

      /* check if over send speed */
      send_timeout_ms = 0;
      if(data->set.max_send_speed > 0)
        send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                                 data->progress.ul_limit_size,
                                                 data->set.max_send_speed,
                                                 data->progress.ul_limit_start,
                                                 now);

      /* check if over recv speed */
      recv_timeout_ms = 0;
      if(data->set.max_recv_speed > 0)
        recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                                 data->progress.dl_limit_size,
                                                 data->set.max_recv_speed,
                                                 data->progress.dl_limit_start,
                                                 now);

      if(send_timeout_ms || recv_timeout_ms) {
        Curl_ratelimit(data, now);
        multistate(data, CURLM_STATE_TOOFAST);
        if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
        break;
      }

      /* read/write data if it is ready to do so */
      result = Curl_readwrite(data->conn, data, &done, &comeback);

      if(done || (result == CURLE_RECV_ERROR)) {
        /* If CURLE_RECV_ERROR happens early enough, we assume it was a race
         * condition and the server closed the re-used connection exactly when
         * we wanted to use it, so figure out if that is indeed the case.
         */
        CURLcode ret = Curl_retry_request(data->conn, &newurl);
        if(!ret)
          retry = (newurl)?TRUE:FALSE;
        else if(!result)
          result = ret;

        if(retry) {
          /* if we are to retry, set the result to OK and consider the
             request as done */
          result = CURLE_OK;
          done = TRUE;
        }
      }
      else if((CURLE_HTTP2_STREAM == result) &&
              Curl_h2_http_1_1_error(data->conn)) {
        CURLcode ret = Curl_retry_request(data->conn, &newurl);

        if(!ret) {
          infof(data, "Downgrades to HTTP/1.1!\n");
          data->set.httpversion = CURL_HTTP_VERSION_1_1;
          /* clear the error message bit too as we ignore the one we got */
          data->state.errorbuf = FALSE;
          if(!newurl)
            /* typically for HTTP_1_1_REQUIRED error on first flight */
            newurl = strdup(data->change.url);
          /* if we are to retry, set the result to OK and consider the request
             as done */
          retry = TRUE;
          result = CURLE_OK;
          done = TRUE;
        }
        else
          result = ret;
      }

      if(result) {
        /*
         * The transfer phase returned error, we mark the connection to get
         * closed to prevent being re-used. This is because we can't possibly
         * know if the connection is in a good shape or not now.  Unless it is
         * a protocol which uses two "channels" like FTP, as then the error
         * happened in the data connection.
         */

        if(!(data->conn->handler->flags & PROTOPT_DUAL) &&
           result != CURLE_HTTP2_STREAM)
          streamclose(data->conn, "Transfer returned error");

        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
      }
      else if(done) {
        followtype follow = FOLLOW_NONE;

        /* call this even if the readwrite function returned error */
        Curl_posttransfer(data);

        /* When we follow redirects or is set to retry the connection, we must
           to go back to the CONNECT state */
        if(data->req.newurl || retry) {
          if(!retry) {
            /* if the URL is a follow-location and not just a retried request
               then figure out the URL here */
            free(newurl);
            newurl = data->req.newurl;
            data->req.newurl = NULL;
            follow = FOLLOW_REDIR;
          }
          else
            follow = FOLLOW_RETRY;
          (void)multi_done(data, CURLE_OK, FALSE);
          /* multi_done() might return CURLE_GOT_NOTHING */
          result = Curl_follow(data, newurl, follow);
          if(!result) {
            multistate(data, CURLM_STATE_CONNECT);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
          free(newurl);
        }
        else {
          /* after the transfer is done, go DONE */

          /* but first check to see if we got a location info even though we're
             not following redirects */
          if(data->req.location) {
            free(newurl);
            newurl = data->req.location;
            data->req.location = NULL;
            result = Curl_follow(data, newurl, FOLLOW_FAKE);
            free(newurl);
            if(result) {
              stream_error = TRUE;
              result = multi_done(data, result, TRUE);
            }
          }

          if(!result) {
            multistate(data, CURLM_STATE_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
      }
      else if(comeback)
        rc = CURLM_CALL_MULTI_PERFORM;
      break;
    }

    case CURLM_STATE_DONE:
      /* this state is highly transient, so run another loop after this */
      rc = CURLM_CALL_MULTI_PERFORM;

      if(data->conn) {
        CURLcode res;

        if(data->conn->bits.multiplex)
          /* Check if we can move pending requests to connection */
          process_pending_handles(multi); /* multiplexing */

        /* post-transfer command */
        res = multi_done(data, result, FALSE);

        /* allow a previously set error code take precedence */
        if(!result)
          result = res;

        /*
         * If there are other handles on the connection, multi_done won't set
         * conn to NULL.  In such a case, curl_multi_remove_handle() can
         * access free'd data, if the connection is free'd and the handle
         * removed before we perform the processing in CURLM_STATE_COMPLETED
         */
        if(data->conn)
          detach_connnection(data);
      }

#ifndef CURL_DISABLE_FTP
      if(data->state.wildcardmatch) {
        if(data->wildcard.state != CURLWC_DONE) {
          /* if a wildcard is set and we are not ending -> lets start again
             with CURLM_STATE_INIT */
          multistate(data, CURLM_STATE_INIT);
          break;
        }
      }
#endif
      /* after we have DONE what we're supposed to do, go COMPLETED, and
         it doesn't matter what the multi_done() returned! */
      multistate(data, CURLM_STATE_COMPLETED);
      break;

    case CURLM_STATE_COMPLETED:
      break;

    case CURLM_STATE_MSGSENT:
      data->result = result;
      return CURLM_OK; /* do nothing */

    default:
      return CURLM_INTERNAL_ERROR;
    }
    statemachine_end:

    if(data->mstate < CURLM_STATE_COMPLETED) {
      if(result) {
        /*
         * If an error was returned, and we aren't in completed state now,
         * then we go to completed and consider this transfer aborted.
         */

        /* NOTE: no attempt to disconnect connections must be made
           in the case blocks above - cleanup happens only here */

        /* Check if we can move pending requests to send pipe */
        process_pending_handles(multi); /* connection */

        if(data->conn) {
          if(stream_error) {
            /* Don't attempt to send data over a connection that timed out */
            bool dead_connection = result == CURLE_OPERATION_TIMEDOUT;
            /* disconnect properly */
            Curl_disconnect(data, data->conn, dead_connection);

            /* This is where we make sure that the conn pointer is reset.
               We don't have to do this in every case block above where a
               failure is detected */
            detach_connnection(data);
          }
        }
        else if(data->mstate == CURLM_STATE_CONNECT) {
          /* Curl_connect() failed */
          (void)Curl_posttransfer(data);
        }

        multistate(data, CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      /* if there's still a connection to use, call the progress function */
      else if(data->conn && Curl_pgrsUpdate(data->conn)) {
        /* aborted due to progress callback return code must close the
           connection */
        result = CURLE_ABORTED_BY_CALLBACK;
        streamclose(data->conn, "Aborted by callback");

        /* if not yet in DONE state, go there, otherwise COMPLETED */
        multistate(data, (data->mstate < CURLM_STATE_DONE)?
                   CURLM_STATE_DONE: CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
    }

    if(CURLM_STATE_COMPLETED == data->mstate) {
      if(data->set.fmultidone) {
        /* signal via callback instead */
        data->set.fmultidone(data, result);
      }
      else {
        /* now fill in the Curl_message with this info */
        msg = &data->msg;

        msg->extmsg.msg = CURLMSG_DONE;
        msg->extmsg.easy_handle = data;
        msg->extmsg.data.result = result;

        rc = multi_addmsg(multi, msg);
        DEBUGASSERT(!data->conn);
      }
      multistate(data, CURLM_STATE_MSGSENT);
    }
  } while((rc == CURLM_CALL_MULTI_PERFORM) || multi_ischanged(multi, FALSE));

  data->result = result;
  return rc;
}